

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O3

vector<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
* absl::lts_20250127::cord_internal::CordzHandle::DiagnosticsGetDeleteQueue(void)

{
  iterator __position;
  vector<absl::lts_20250127::cord_internal::CordzHandle_const*,std::allocator<absl::lts_20250127::cord_internal::CordzHandle_const*>>
  *in_RDI;
  CordzHandle *local_18;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  anon_unknown_0::GlobalQueue();
  Mutex::Lock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
  for (local_18 = (CordzHandle *)anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_;
      local_18 != (CordzHandle *)0x0; local_18 = local_18->dq_prev_) {
    __position._M_current = *(CordzHandle ***)(in_RDI + 8);
    if (__position._M_current == *(CordzHandle ***)(in_RDI + 0x10)) {
      std::
      vector<absl::lts_20250127::cord_internal::CordzHandle_const*,std::allocator<absl::lts_20250127::cord_internal::CordzHandle_const*>>
      ::_M_realloc_insert<absl::lts_20250127::cord_internal::CordzHandle_const*const&>
                (in_RDI,__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 8;
    }
  }
  Mutex::Unlock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
  return (vector<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
          *)in_RDI;
}

Assistant:

std::vector<const CordzHandle*> CordzHandle::DiagnosticsGetDeleteQueue() {
  std::vector<const CordzHandle*> handles;
  Queue& global_queue = GlobalQueue();
  MutexLock lock(&global_queue.mutex);
  CordzHandle* dq_tail = global_queue.dq_tail.load(std::memory_order_acquire);
  for (const CordzHandle* p = dq_tail; p; p = p->dq_prev_) {
    handles.push_back(p);
  }
  return handles;
}